

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O0

string * __thiscall
sqlcheck::GetBooleanString_abi_cxx11_(string *__return_storage_ptr__,sqlcheck *this,bool *status)

{
  allocator local_2d [20];
  allocator local_19;
  sqlcheck *local_18;
  bool *status_local;
  
  local_18 = this;
  status_local = (bool *)__return_storage_ptr__;
  if (((byte)*this & 1) == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ENABLED",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"DISABLED",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetBooleanString(const bool& status){
  if(status == true){
    return "ENABLED";
  }
  else {
    return "DISABLED";
  }
}